

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::TypeOf_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,Type *type,Imports *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  long *plVar6;
  string *extraout_RAX;
  Import *pIVar7;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  size_type *psVar8;
  string local_88;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  EnumDef *pEStack_38;
  uint16_t local_30;
  
  if (type->enum_def != (EnumDef *)0x0) {
    psVar5 = EnumType_abi_cxx11_(__return_storage_ptr__,this,type->enum_def,imports);
    return psVar5;
  }
  BVar2 = type->base_type;
  if (0xb < BVar2 - BASE_TYPE_UTYPE) {
    switch(BVar2) {
    case BASE_TYPE_STRING:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"str","");
      return extraout_RAX;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      paVar1 = &local_88.field_2;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"typing","");
      Imports::Import(imports,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_48._M_allocated_capacity._0_4_ = type->element;
      local_30 = type->fixed_length;
      local_48._M_allocated_capacity._4_4_ = 0;
      local_48._8_8_ = type->struct_def;
      pEStack_38 = type->enum_def;
      TypeOf_abi_cxx11_((string *)local_68,this,(Type *)&local_48,imports);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x371c0e);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar8;
        local_88._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        lVar4 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      psVar5 = (string *)(local_68 + 0x10);
      if ((string *)local_68._0_8_ != psVar5) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        psVar5 = extraout_RAX_01;
      }
      break;
    case BASE_TYPE_STRUCT:
      anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                (&local_88,(PythonStubGenerator *)this,type->struct_def);
      (**(code **)(*(long *)(this + 8) + 0x78))(local_68,this + 8,type->struct_def);
      pIVar7 = Imports::Import(imports,&local_88,(string *)local_68);
      if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pIVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pIVar7->name)._M_string_length);
      psVar5 = extraout_RAX_00;
      break;
    case BASE_TYPE_UNION:
      psVar5 = UnionType_abi_cxx11_(__return_storage_ptr__,this,(EnumDef *)0x0,imports);
      return psVar5;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                    ,0xf2,
                    "std::string flatbuffers::python::(anonymous namespace)::PythonStubGenerator::TypeOf(const Type &, Imports *) const"
                   );
    }
    return psVar5;
  }
  psVar5 = ScalarType_abi_cxx11_
                     (__return_storage_ptr__,(PythonStubGenerator *)(ulong)BVar2,BASE_TYPE_NONE);
  return psVar5;
}

Assistant:

std::string TypeOf(const Type &type, Imports *imports) const {
    if (type.enum_def != nullptr) return EnumType(*type.enum_def, imports);
    if (IsScalar(type.base_type)) return ScalarType(type.base_type);

    switch (type.base_type) {
      case BASE_TYPE_STRUCT: {
        const Import &import = imports->Import(ModuleFor(type.struct_def),
                                               namer_.Type(*type.struct_def));
        return import.name;
      }
      case BASE_TYPE_STRING:
        return "str";
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR: {
        imports->Import("typing");
        return "typing.List[" + TypeOf(type.VectorType(), imports) + "]";
      }
      case BASE_TYPE_UNION:
        return UnionType(*type.enum_def, imports);
      default:
        FLATBUFFERS_ASSERT(0);
        return "";
    }
  }